

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_jpg_core(stbi__write_context *s,int width,int height,int comp,void *data,int quality)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  float fVar9;
  float fVar10;
  stbi__write_context *psVar11;
  int iVar12;
  uchar *puVar13;
  float *pfVar14;
  undefined8 uVar15;
  uint uVar16;
  long lVar17;
  float *pfVar18;
  int iVar19;
  undefined4 in_register_00000034;
  float *pfVar20;
  uint uVar21;
  byte *pbVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int bitCnt;
  int bitBuf;
  uint local_600;
  int local_5fc;
  stbi__write_context *local_5f8;
  int local_5ec;
  int local_5e8;
  uint local_5e4;
  undefined8 local_5e0;
  long local_5d8;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  uchar UVTable [64];
  uchar YTable [64];
  float UDU [64];
  float YDU [64];
  float fdtbl_UV [64];
  float VDU [64];
  float fdtbl_Y [64];
  
  uVar15 = CONCAT44(in_register_00000034,width);
  iVar12 = 0;
  if ((((0xfffffffb < comp - 5U) && (iVar12 = 0, height != 0)) && (iVar12 = 0, width != 0)) &&
     (data != (void *)0x0)) {
    uVar21 = 100;
    if (quality < 100) {
      uVar21 = quality;
    }
    uVar16 = 1;
    if (1 < (int)uVar21) {
      uVar16 = uVar21;
    }
    uVar21 = 0x5a;
    if (quality != 0) {
      uVar21 = uVar16;
    }
    if (uVar21 < 0x32) {
      uVar21 = 5000 / (uVar21 & 0xffff);
    }
    else {
      uVar21 = uVar21 * -2 + 200;
    }
    puVar13 = "";
    lVar17 = 0;
    do {
      iVar12 = (int)(*(int *)((long)stbi_write_jpg_core::YQT + lVar17) * uVar21 + 0x32) / 100;
      if (0xfe < iVar12) {
        iVar12 = 0xff;
      }
      if (iVar12 < 2) {
        iVar12 = 1;
      }
      bVar1 = *puVar13;
      YTable[bVar1] = (uchar)iVar12;
      iVar12 = (int)(*(int *)((long)stbi_write_jpg_core::UVQT + lVar17) * uVar21 + 0x32) / 100;
      if (0xfe < iVar12) {
        iVar12 = 0xff;
      }
      if (iVar12 < 2) {
        iVar12 = 1;
      }
      UVTable[bVar1] = (uchar)iVar12;
      lVar17 = lVar17 + 4;
      puVar13 = puVar13 + 1;
    } while (lVar17 != 0x100);
    lVar17 = 0;
    local_5d8 = 0;
    do {
      lVar25 = (long)(int)local_5d8;
      local_5d8 = lVar25 + 8;
      fVar28 = stbi_write_jpg_core::aasf[lVar17];
      pbVar22 = "" + lVar25 + 3;
      lVar26 = 0;
      do {
        bVar1 = pbVar22[-3];
        bVar2 = pbVar22[-2];
        bVar3 = pbVar22[-1];
        bVar4 = *pbVar22;
        auVar5[0xc] = YTable[bVar4];
        auVar5._0_12_ = ZEXT812(0);
        auVar6._10_3_ = auVar5._10_3_;
        auVar6._0_10_ = (unkuint10)YTable[bVar3] << 0x40;
        fVar29 = *(float *)((long)stbi_write_jpg_core::aasf + lVar26);
        fVar30 = *(float *)((long)stbi_write_jpg_core::aasf + lVar26 + 4);
        fVar9 = *(float *)((long)stbi_write_jpg_core::aasf + lVar26 + 8);
        fVar10 = *(float *)((long)stbi_write_jpg_core::aasf + lVar26 + 0xc);
        auVar32._0_4_ = (float)YTable[bVar1] * fVar28 * fVar29;
        auVar32._4_4_ = (float)YTable[bVar2] * fVar28 * fVar30;
        auVar32._8_4_ = (float)auVar6._8_4_ * fVar28 * fVar9;
        auVar32._12_4_ = (float)(uint3)(auVar5._10_3_ >> 0x10) * fVar28 * fVar10;
        auVar32 = divps(_DAT_001b21a0,auVar32);
        *(undefined1 (*) [16])((long)fdtbl_Y + lVar26 + lVar25 * 4) = auVar32;
        auVar7[0xc] = UVTable[bVar4];
        auVar7._0_12_ = ZEXT812(0);
        auVar8._10_3_ = auVar7._10_3_;
        auVar8._0_10_ = (unkuint10)UVTable[bVar3] << 0x40;
        auVar31._0_4_ = (float)UVTable[bVar1] * fVar28 * fVar29;
        auVar31._4_4_ = (float)UVTable[bVar2] * fVar28 * fVar30;
        auVar31._8_4_ = (float)auVar8._8_4_ * fVar28 * fVar9;
        auVar31._12_4_ = (float)(uint3)(auVar7._10_3_ >> 0x10) * fVar28 * fVar10;
        auVar32 = divps(_DAT_001b21a0,auVar31);
        *(undefined1 (*) [16])((long)fdtbl_UV + lVar26 + lVar25 * 4) = auVar32;
        lVar26 = lVar26 + 0x10;
        pbVar22 = pbVar22 + 4;
      } while (lVar26 != 0x20);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    YDU[0] = 1.0156891e-28;
    YDU[1]._0_1_ = 8;
    YDU[1]._1_1_ = (undefined1)((uint)height >> 8);
    YDU[1]._2_1_ = (undefined1)height;
    YDU[1]._3_1_ = (undefined1)((uint)width >> 8);
    YDU[2]._0_1_ = (undefined1)width;
    YDU._9_8_ = 0x301110200110103;
    YDU._17_4_ = 0xc4ff0111;
    YDU[5]._1_2_ = 0xa201;
    YDU[5]._3_1_ = 0;
    local_5f8 = s;
    local_5e0 = uVar15;
    (*s->func)(s->context,stbi_write_jpg_core::head0,0x19);
    (*s->func)(s->context,YTable,0x40);
    UDU[0]._0_1_ = 1;
    (*s->func)(s->context,UDU,1);
    (*s->func)(s->context,UVTable,0x40);
    (*s->func)(s->context,YDU,0x18);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xc);
    UDU[0]._0_1_ = 0x10;
    (*s->func)(s->context,UDU,1);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"\x01\x02\x03",0xa2);
    UDU[0]._0_1_ = 1;
    (*s->func)(s->context,UDU,1);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xc);
    UDU[0]._0_1_ = 0x11;
    (*s->func)(s->context,UDU,1);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xa2);
    (*s->func)(s->context,stbi_write_jpg_core::head2,0xe);
    bitBuf = 0;
    bitCnt = 0;
    if (0 < height) {
      local_5c0 = comp * width;
      local_5cc = (width + -1) * comp;
      local_5c8 = comp * 8;
      local_5e4 = 8;
      local_600 = 0;
      iVar12 = 0;
      local_5e8 = 0;
      local_5ec = 0;
      do {
        if (0 < (int)uVar15) {
          local_5fc = local_5cc;
          iVar19 = 0;
          do {
            pfVar20 = YDU;
            pfVar14 = VDU;
            pfVar18 = UDU;
            local_5bc = stbi__flip_vertically_on_write;
            uVar21 = local_600;
            do {
              uVar16 = ~uVar21 + height;
              if (stbi__flip_vertically_on_write == 0) {
                uVar16 = uVar21;
              }
              local_5d8 = CONCAT44(local_5d8._4_4_,uVar21);
              iVar23 = (~uVar21 + height) * local_5c0;
              if ((int)uVar21 < height) {
                iVar23 = 0;
              }
              iVar23 = (uVar16 * (int)local_5e0 + iVar19) * comp + iVar23;
              lVar17 = 0;
              iVar24 = local_5fc;
              do {
                iVar27 = iVar24;
                if (iVar19 + (int)lVar17 < (int)local_5e0) {
                  iVar27 = 0;
                }
                iVar27 = iVar27 + iVar23;
                fVar28 = (float)*(byte *)((long)data + (long)iVar27);
                fVar29 = (float)*(byte *)((long)data + (long)(int)(iVar27 + (uint)(2 < comp)));
                fVar30 = (float)*(byte *)((long)data + (long)(int)(iVar27 + (uint)(2 < comp) * 2));
                pfVar20[lVar17] = fVar30 * 0.114 + fVar28 * 0.299 + fVar29 * 0.587 + -128.0;
                pfVar18[lVar17] = fVar30 * 0.5 + fVar28 * -0.16874 + fVar29 * -0.33126;
                pfVar14[lVar17] = fVar30 * -0.08131 + fVar28 * 0.5 + fVar29 * -0.41869;
                lVar17 = lVar17 + 1;
                iVar23 = iVar23 + comp;
                iVar24 = iVar24 - comp;
              } while ((int)lVar17 != 8);
              uVar21 = uVar21 + 1;
              pfVar20 = pfVar20 + 8;
              pfVar18 = pfVar18 + 8;
              pfVar14 = pfVar14 + 8;
            } while (uVar21 != local_5e4);
            local_5c4 = iVar12;
            local_5ec = stbiw__jpg_processDU
                                  (local_5f8,&bitBuf,&bitCnt,YDU,fdtbl_Y,local_5ec,
                                   stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
            local_5e8 = stbiw__jpg_processDU
                                  (local_5f8,&bitBuf,&bitCnt,UDU,fdtbl_UV,local_5e8,
                                   stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
            iVar12 = stbiw__jpg_processDU
                               (local_5f8,&bitBuf,&bitCnt,VDU,fdtbl_UV,local_5c4,
                                stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
            iVar19 = iVar19 + 8;
            local_5fc = local_5fc - local_5c8;
            uVar15 = local_5e0;
          } while (iVar19 < (int)local_5e0);
        }
        local_600 = local_600 + 8;
        local_5e4 = local_5e4 + 8;
      } while ((int)local_600 < height);
    }
    psVar11 = local_5f8;
    stbiw__jpg_writeBits(local_5f8,&bitBuf,&bitCnt,(unsigned_short *)0x7f);
    YDU[0] = (float)CONCAT31(YDU[0]._1_3_,0xff);
    (*psVar11->func)(psVar11->context,YDU,1);
    YDU[0] = (float)CONCAT31(YDU[0]._1_3_,0xd9);
    (*psVar11->func)(psVar11->context,YDU,1);
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

static int stbi_write_jpg_core(stbi__write_context *s, int width, int height, int comp, const void* data, int quality) {
   // Constants that don't pollute global namespace
   static const unsigned char std_dc_luminance_nrcodes[] = {0,0,1,5,1,1,1,1,1,1,0,0,0,0,0,0,0};
   static const unsigned char std_dc_luminance_values[] = {0,1,2,3,4,5,6,7,8,9,10,11};
   static const unsigned char std_ac_luminance_nrcodes[] = {0,0,2,1,3,3,2,4,3,5,5,4,4,0,0,1,0x7d};
   static const unsigned char std_ac_luminance_values[] = {
      0x01,0x02,0x03,0x00,0x04,0x11,0x05,0x12,0x21,0x31,0x41,0x06,0x13,0x51,0x61,0x07,0x22,0x71,0x14,0x32,0x81,0x91,0xa1,0x08,
      0x23,0x42,0xb1,0xc1,0x15,0x52,0xd1,0xf0,0x24,0x33,0x62,0x72,0x82,0x09,0x0a,0x16,0x17,0x18,0x19,0x1a,0x25,0x26,0x27,0x28,
      0x29,0x2a,0x34,0x35,0x36,0x37,0x38,0x39,0x3a,0x43,0x44,0x45,0x46,0x47,0x48,0x49,0x4a,0x53,0x54,0x55,0x56,0x57,0x58,0x59,
      0x5a,0x63,0x64,0x65,0x66,0x67,0x68,0x69,0x6a,0x73,0x74,0x75,0x76,0x77,0x78,0x79,0x7a,0x83,0x84,0x85,0x86,0x87,0x88,0x89,
      0x8a,0x92,0x93,0x94,0x95,0x96,0x97,0x98,0x99,0x9a,0xa2,0xa3,0xa4,0xa5,0xa6,0xa7,0xa8,0xa9,0xaa,0xb2,0xb3,0xb4,0xb5,0xb6,
      0xb7,0xb8,0xb9,0xba,0xc2,0xc3,0xc4,0xc5,0xc6,0xc7,0xc8,0xc9,0xca,0xd2,0xd3,0xd4,0xd5,0xd6,0xd7,0xd8,0xd9,0xda,0xe1,0xe2,
      0xe3,0xe4,0xe5,0xe6,0xe7,0xe8,0xe9,0xea,0xf1,0xf2,0xf3,0xf4,0xf5,0xf6,0xf7,0xf8,0xf9,0xfa
   };
   static const unsigned char std_dc_chrominance_nrcodes[] = {0,0,3,1,1,1,1,1,1,1,1,1,0,0,0,0,0};
   static const unsigned char std_dc_chrominance_values[] = {0,1,2,3,4,5,6,7,8,9,10,11};
   static const unsigned char std_ac_chrominance_nrcodes[] = {0,0,2,1,2,4,4,3,4,7,5,4,4,0,1,2,0x77};
   static const unsigned char std_ac_chrominance_values[] = {
      0x00,0x01,0x02,0x03,0x11,0x04,0x05,0x21,0x31,0x06,0x12,0x41,0x51,0x07,0x61,0x71,0x13,0x22,0x32,0x81,0x08,0x14,0x42,0x91,
      0xa1,0xb1,0xc1,0x09,0x23,0x33,0x52,0xf0,0x15,0x62,0x72,0xd1,0x0a,0x16,0x24,0x34,0xe1,0x25,0xf1,0x17,0x18,0x19,0x1a,0x26,
      0x27,0x28,0x29,0x2a,0x35,0x36,0x37,0x38,0x39,0x3a,0x43,0x44,0x45,0x46,0x47,0x48,0x49,0x4a,0x53,0x54,0x55,0x56,0x57,0x58,
      0x59,0x5a,0x63,0x64,0x65,0x66,0x67,0x68,0x69,0x6a,0x73,0x74,0x75,0x76,0x77,0x78,0x79,0x7a,0x82,0x83,0x84,0x85,0x86,0x87,
      0x88,0x89,0x8a,0x92,0x93,0x94,0x95,0x96,0x97,0x98,0x99,0x9a,0xa2,0xa3,0xa4,0xa5,0xa6,0xa7,0xa8,0xa9,0xaa,0xb2,0xb3,0xb4,
      0xb5,0xb6,0xb7,0xb8,0xb9,0xba,0xc2,0xc3,0xc4,0xc5,0xc6,0xc7,0xc8,0xc9,0xca,0xd2,0xd3,0xd4,0xd5,0xd6,0xd7,0xd8,0xd9,0xda,
      0xe2,0xe3,0xe4,0xe5,0xe6,0xe7,0xe8,0xe9,0xea,0xf2,0xf3,0xf4,0xf5,0xf6,0xf7,0xf8,0xf9,0xfa
   };
   // Huffman tables
   static const unsigned short YDC_HT[256][2] = { {0,2},{2,3},{3,3},{4,3},{5,3},{6,3},{14,4},{30,5},{62,6},{126,7},{254,8},{510,9}};
   static const unsigned short UVDC_HT[256][2] = { {0,2},{1,2},{2,2},{6,3},{14,4},{30,5},{62,6},{126,7},{254,8},{510,9},{1022,10},{2046,11}};
   static const unsigned short YAC_HT[256][2] = {
      {10,4},{0,2},{1,2},{4,3},{11,4},{26,5},{120,7},{248,8},{1014,10},{65410,16},{65411,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {12,4},{27,5},{121,7},{502,9},{2038,11},{65412,16},{65413,16},{65414,16},{65415,16},{65416,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {28,5},{249,8},{1015,10},{4084,12},{65417,16},{65418,16},{65419,16},{65420,16},{65421,16},{65422,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {58,6},{503,9},{4085,12},{65423,16},{65424,16},{65425,16},{65426,16},{65427,16},{65428,16},{65429,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {59,6},{1016,10},{65430,16},{65431,16},{65432,16},{65433,16},{65434,16},{65435,16},{65436,16},{65437,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {122,7},{2039,11},{65438,16},{65439,16},{65440,16},{65441,16},{65442,16},{65443,16},{65444,16},{65445,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {123,7},{4086,12},{65446,16},{65447,16},{65448,16},{65449,16},{65450,16},{65451,16},{65452,16},{65453,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {250,8},{4087,12},{65454,16},{65455,16},{65456,16},{65457,16},{65458,16},{65459,16},{65460,16},{65461,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {504,9},{32704,15},{65462,16},{65463,16},{65464,16},{65465,16},{65466,16},{65467,16},{65468,16},{65469,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {505,9},{65470,16},{65471,16},{65472,16},{65473,16},{65474,16},{65475,16},{65476,16},{65477,16},{65478,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {506,9},{65479,16},{65480,16},{65481,16},{65482,16},{65483,16},{65484,16},{65485,16},{65486,16},{65487,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1017,10},{65488,16},{65489,16},{65490,16},{65491,16},{65492,16},{65493,16},{65494,16},{65495,16},{65496,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1018,10},{65497,16},{65498,16},{65499,16},{65500,16},{65501,16},{65502,16},{65503,16},{65504,16},{65505,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2040,11},{65506,16},{65507,16},{65508,16},{65509,16},{65510,16},{65511,16},{65512,16},{65513,16},{65514,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {65515,16},{65516,16},{65517,16},{65518,16},{65519,16},{65520,16},{65521,16},{65522,16},{65523,16},{65524,16},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2041,11},{65525,16},{65526,16},{65527,16},{65528,16},{65529,16},{65530,16},{65531,16},{65532,16},{65533,16},{65534,16},{0,0},{0,0},{0,0},{0,0},{0,0}
   };
   static const unsigned short UVAC_HT[256][2] = {
      {0,2},{1,2},{4,3},{10,4},{24,5},{25,5},{56,6},{120,7},{500,9},{1014,10},{4084,12},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {11,4},{57,6},{246,8},{501,9},{2038,11},{4085,12},{65416,16},{65417,16},{65418,16},{65419,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {26,5},{247,8},{1015,10},{4086,12},{32706,15},{65420,16},{65421,16},{65422,16},{65423,16},{65424,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {27,5},{248,8},{1016,10},{4087,12},{65425,16},{65426,16},{65427,16},{65428,16},{65429,16},{65430,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {58,6},{502,9},{65431,16},{65432,16},{65433,16},{65434,16},{65435,16},{65436,16},{65437,16},{65438,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {59,6},{1017,10},{65439,16},{65440,16},{65441,16},{65442,16},{65443,16},{65444,16},{65445,16},{65446,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {121,7},{2039,11},{65447,16},{65448,16},{65449,16},{65450,16},{65451,16},{65452,16},{65453,16},{65454,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {122,7},{2040,11},{65455,16},{65456,16},{65457,16},{65458,16},{65459,16},{65460,16},{65461,16},{65462,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {249,8},{65463,16},{65464,16},{65465,16},{65466,16},{65467,16},{65468,16},{65469,16},{65470,16},{65471,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {503,9},{65472,16},{65473,16},{65474,16},{65475,16},{65476,16},{65477,16},{65478,16},{65479,16},{65480,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {504,9},{65481,16},{65482,16},{65483,16},{65484,16},{65485,16},{65486,16},{65487,16},{65488,16},{65489,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {505,9},{65490,16},{65491,16},{65492,16},{65493,16},{65494,16},{65495,16},{65496,16},{65497,16},{65498,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {506,9},{65499,16},{65500,16},{65501,16},{65502,16},{65503,16},{65504,16},{65505,16},{65506,16},{65507,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2041,11},{65508,16},{65509,16},{65510,16},{65511,16},{65512,16},{65513,16},{65514,16},{65515,16},{65516,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {16352,14},{65517,16},{65518,16},{65519,16},{65520,16},{65521,16},{65522,16},{65523,16},{65524,16},{65525,16},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1018,10},{32707,15},{65526,16},{65527,16},{65528,16},{65529,16},{65530,16},{65531,16},{65532,16},{65533,16},{65534,16},{0,0},{0,0},{0,0},{0,0},{0,0}
   };
   static const int YQT[] = {16,11,10,16,24,40,51,61,12,12,14,19,26,58,60,55,14,13,16,24,40,57,69,56,14,17,22,29,51,87,80,62,18,22,
                             37,56,68,109,103,77,24,35,55,64,81,104,113,92,49,64,78,87,103,121,120,101,72,92,95,98,112,100,103,99};
   static const int UVQT[] = {17,18,24,47,99,99,99,99,18,21,26,66,99,99,99,99,24,26,56,99,99,99,99,99,47,66,99,99,99,99,99,99,
                              99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99};
   static const float aasf[] = { 1.0f * 2.828427125f, 1.387039845f * 2.828427125f, 1.306562965f * 2.828427125f, 1.175875602f * 2.828427125f, 
                                 1.0f * 2.828427125f, 0.785694958f * 2.828427125f, 0.541196100f * 2.828427125f, 0.275899379f * 2.828427125f };

   int row, col, i, k;
   float fdtbl_Y[64], fdtbl_UV[64];
   unsigned char YTable[64], UVTable[64];

   if(!data || !width || !height || comp > 4 || comp < 1) {
      return 0;
   }

   quality = quality ? quality : 90;
   quality = quality < 1 ? 1 : quality > 100 ? 100 : quality;
   quality = quality < 50 ? 5000 / quality : 200 - quality * 2;

   for(i = 0; i < 64; ++i) {
      int uvti, yti = (YQT[i]*quality+50)/100;
      YTable[stbiw__jpg_ZigZag[i]] = (unsigned char) (yti < 1 ? 1 : yti > 255 ? 255 : yti);
      uvti = (UVQT[i]*quality+50)/100;
      UVTable[stbiw__jpg_ZigZag[i]] = (unsigned char) (uvti < 1 ? 1 : uvti > 255 ? 255 : uvti);
   }

   for(row = 0, k = 0; row < 8; ++row) {
      for(col = 0; col < 8; ++col, ++k) {
         fdtbl_Y[k]  = 1 / (YTable [stbiw__jpg_ZigZag[k]] * aasf[row] * aasf[col]);
         fdtbl_UV[k] = 1 / (UVTable[stbiw__jpg_ZigZag[k]] * aasf[row] * aasf[col]);
      }
   }

   // Write Headers
   {
      static const unsigned char head0[] = { 0xFF,0xD8,0xFF,0xE0,0,0x10,'J','F','I','F',0,1,1,0,0,1,0,1,0,0,0xFF,0xDB,0,0x84,0 };
      static const unsigned char head2[] = { 0xFF,0xDA,0,0xC,3,1,0,2,0x11,3,0x11,0,0x3F,0 };
      const unsigned char head1[] = { 0xFF,0xC0,0,0x11,8,(unsigned char)(height>>8),STBIW_UCHAR(height),(unsigned char)(width>>8),STBIW_UCHAR(width),
                                      3,1,0x11,0,2,0x11,1,3,0x11,1,0xFF,0xC4,0x01,0xA2,0 };
      s->func(s->context, (void*)head0, sizeof(head0));
      s->func(s->context, (void*)YTable, sizeof(YTable));
      stbiw__putc(s, 1);
      s->func(s->context, UVTable, sizeof(UVTable));
      s->func(s->context, (void*)head1, sizeof(head1));
      s->func(s->context, (void*)(std_dc_luminance_nrcodes+1), sizeof(std_dc_luminance_nrcodes)-1);
      s->func(s->context, (void*)std_dc_luminance_values, sizeof(std_dc_luminance_values));
      stbiw__putc(s, 0x10); // HTYACinfo
      s->func(s->context, (void*)(std_ac_luminance_nrcodes+1), sizeof(std_ac_luminance_nrcodes)-1);
      s->func(s->context, (void*)std_ac_luminance_values, sizeof(std_ac_luminance_values));
      stbiw__putc(s, 1); // HTUDCinfo
      s->func(s->context, (void*)(std_dc_chrominance_nrcodes+1), sizeof(std_dc_chrominance_nrcodes)-1);
      s->func(s->context, (void*)std_dc_chrominance_values, sizeof(std_dc_chrominance_values));
      stbiw__putc(s, 0x11); // HTUACinfo
      s->func(s->context, (void*)(std_ac_chrominance_nrcodes+1), sizeof(std_ac_chrominance_nrcodes)-1);
      s->func(s->context, (void*)std_ac_chrominance_values, sizeof(std_ac_chrominance_values));
      s->func(s->context, (void*)head2, sizeof(head2));
   }

   // Encode 8x8 macroblocks
   {
      static const unsigned short fillBits[] = {0x7F, 7};
      const unsigned char *imageData = (const unsigned char *)data;
      int DCY=0, DCU=0, DCV=0;
      int bitBuf=0, bitCnt=0;
      // comp == 2 is grey+alpha (alpha is ignored)
      int ofsG = comp > 2 ? 1 : 0, ofsB = comp > 2 ? 2 : 0;
      int x, y, pos;
      for(y = 0; y < height; y += 8) {
         for(x = 0; x < width; x += 8) {
            float YDU[64], UDU[64], VDU[64];
            for(row = y, pos = 0; row < y+8; ++row) {
               for(col = x; col < x+8; ++col, ++pos) {
                  int p = (stbi__flip_vertically_on_write ? height-1-row : row)*width*comp + col*comp;
                  float r, g, b;
                  if(row >= height) {
                     p -= width*comp*(row+1 - height);
                  }
                  if(col >= width) {
                     p -= comp*(col+1 - width);
                  }

                  r = imageData[p+0];
                  g = imageData[p+ofsG];
                  b = imageData[p+ofsB];
                  YDU[pos]=+0.29900f*r+0.58700f*g+0.11400f*b-128;
                  UDU[pos]=-0.16874f*r-0.33126f*g+0.50000f*b;
                  VDU[pos]=+0.50000f*r-0.41869f*g-0.08131f*b;
               }
            }

            DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, YDU, fdtbl_Y, DCY, YDC_HT, YAC_HT);
            DCU = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, UDU, fdtbl_UV, DCU, UVDC_HT, UVAC_HT);
            DCV = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, VDU, fdtbl_UV, DCV, UVDC_HT, UVAC_HT);
         }
      }

      // Do the bit alignment of the EOI marker
      stbiw__jpg_writeBits(s, &bitBuf, &bitCnt, fillBits);
   }

   // EOI
   stbiw__putc(s, 0xFF);
   stbiw__putc(s, 0xD9);

   return 1;
}